

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qresource.cpp
# Opt level: O1

void __thiscall QResourceFileEnginePrivate::uncompress(QResourceFileEnginePrivate *this)

{
  QResourcePrivate *pQVar1;
  QArrayData *data;
  char *pcVar2;
  qsizetype qVar3;
  long in_FS_OFFSET;
  QByteArray local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->resource).d_ptr.d;
  QResourcePrivate::ensureInitialized(pQVar1);
  if ((pQVar1->compressionAlgo != '\0') && ((this->uncompressed).d.size == 0)) {
    pQVar1 = (this->resource).d_ptr.d;
    QResourcePrivate::ensureInitialized(pQVar1);
    if (pQVar1->size != 0) {
      QResource::uncompressedData(&local_38,&this->resource);
      data = &((this->uncompressed).d.d)->super_QArrayData;
      pcVar2 = (this->uncompressed).d.ptr;
      (this->uncompressed).d.d = local_38.d.d;
      (this->uncompressed).d.ptr = local_38.d.ptr;
      qVar3 = (this->uncompressed).d.size;
      (this->uncompressed).d.size = local_38.d.size;
      local_38.d.d = (Data *)data;
      local_38.d.ptr = pcVar2;
      local_38.d.size = qVar3;
      if (data != (QArrayData *)0x0) {
        LOCK();
        (data->ref_)._q_value.super___atomic_base<int>._M_i =
             (data->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((data->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(data,1,0x10);
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QResourceFileEnginePrivate::uncompress() const
{
    if (resource.compressionAlgorithm() == QResource::NoCompression
            || !uncompressed.isEmpty() || resource.size() == 0)
        return;     // nothing to do
    uncompressed = resource.uncompressedData();
}